

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall Server::Private::Private(Private *this)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  Item *pIVar6;
  Item *pIVar7;
  TimerImpl *local_40;
  long local_38;
  
  this->_keepAlive = false;
  this->_noDelay = false;
  this->_sendBufferSize = 0;
  this->_receiveBufferSize = 0;
  this->_reuseAddress = true;
  Socket::Poll::Poll(&this->_sockets);
  pIVar1 = &(this->_queuedTimers).endItem;
  (this->_queuedTimers)._end.item = pIVar1;
  (this->_queuedTimers)._begin.item = pIVar1;
  (this->_queuedTimers).root = (Item *)0x0;
  (this->_queuedTimers)._size = 0;
  (this->_queuedTimers).endItem.key = 0;
  (this->_queuedTimers).endItem.value = (TimerImpl *)0x0;
  (this->_queuedTimers).endItem.parent = (Item *)0x0;
  (this->_queuedTimers).endItem.next = (Item *)0x0;
  (this->_queuedTimers).endItem.prev = (Item *)0x0;
  (this->_queuedTimers).freeItem = (Item *)0x0;
  (this->_queuedTimers).blocks = (ItemBlock *)0x0;
  pIVar2 = &(this->_listeners).endItem;
  (this->_listeners)._end.item = pIVar2;
  (this->_listeners)._begin.item = pIVar2;
  (this->_listeners)._size = 0;
  (this->_listeners).endItem.prev = (Item *)0x0;
  (this->_listeners).blocks = (ItemBlock *)0x0;
  (this->_listeners).endItem.next = (Item *)0x0;
  (this->_listeners).freeItem = (Item *)0x0;
  pIVar3 = &(this->_establishers).endItem;
  (this->_establishers)._end.item = pIVar3;
  (this->_establishers)._begin.item = pIVar3;
  (this->_establishers)._size = 0;
  (this->_establishers).endItem.prev = (Item *)0x0;
  (this->_establishers).blocks = (ItemBlock *)0x0;
  (this->_establishers).endItem.next = (Item *)0x0;
  (this->_establishers).freeItem = (Item *)0x0;
  pIVar4 = &(this->_clients).endItem;
  (this->_clients)._end.item = pIVar4;
  (this->_clients)._begin.item = pIVar4;
  (this->_clients).endItem.next = (Item *)0x0;
  (this->_clients).freeItem = (Item *)0x0;
  (this->_clients).blocks = (ItemBlock *)0x0;
  (this->_clients)._size = 0;
  (this->_clients).endItem.prev = (Item *)0x0;
  pIVar5 = &(this->_timers).endItem;
  (this->_timers)._end.item = pIVar5;
  (this->_timers)._begin.item = pIVar5;
  (this->_timers)._size = 0;
  (this->_timers).endItem.prev = (Item *)0x0;
  (this->_timers).blocks = (ItemBlock *)0x0;
  (this->_timers).endItem.next = (Item *)0x0;
  (this->_timers).freeItem = (Item *)0x0;
  pIVar6 = &(this->_resolvers).endItem;
  (this->_resolvers)._end.item = pIVar6;
  (this->_resolvers)._begin.item = pIVar6;
  (this->_resolvers)._size = 0;
  (this->_resolvers).endItem.prev = (Item *)0x0;
  (this->_resolvers).blocks = (ItemBlock *)0x0;
  (this->_resolvers).endItem.next = (Item *)0x0;
  (this->_resolvers).freeItem = (Item *)0x0;
  pIVar7 = &(this->_closingClients).endItem;
  (this->_closingClients)._end.item = pIVar7;
  (this->_closingClients)._begin.item = pIVar7;
  (this->_closingClients)._size = 0;
  (this->_closingClients).data = (Item **)0x0;
  (this->_closingClients).endItem.key = (ClientImpl *)0x0;
  (this->_closingClients).endItem.prev = (Item *)0x0;
  (this->_closingClients).endItem.next = (Item *)0x0;
  (this->_closingClients).freeItem = (Item *)0x0;
  (this->_closingClients).blocks = (ItemBlock *)0x0;
  (this->_closingClients).capacity = 8;
  Mutex::Mutex(&this->_interruptMutex);
  this->_interrupted = false;
  local_38 = 0;
  local_40 = (TimerImpl *)0x0;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert(&this->_queuedTimers,&local_38,&local_40);
  return;
}

Assistant:

Server::Private::Private() : _keepAlive(false), _noDelay(false), _sendBufferSize(0), _receiveBufferSize(0), _reuseAddress(true), _closingClients(8), _interrupted(false)
{
  _queuedTimers.insert(0, 0); // add default timeout timer
}